

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O0

void __thiscall choc::text::CodePrinter::~CodePrinter(CodePrinter *this)

{
  CodePrinter *this_local;
  
  std::__cxx11::string::~string((string *)&this->sectionBreakString);
  std::__cxx11::string::~string((string *)&this->newLineString);
  std::vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>::
  ~vector(&this->lines);
  return;
}

Assistant:

~CodePrinter() = default;